

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O0

void __thiscall wabt::LoadStoreTracking::CheckLayouts(LoadStoreTracking *this)

{
  bool bVar1;
  uint uVar2;
  reference ppVar3;
  size_type sVar4;
  reference ppVar5;
  ulong uVar6;
  Address mask;
  pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess> *access;
  iterator __end3;
  iterator __begin3;
  map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
  *__range3;
  long lStack_38;
  uint32_t idx;
  uint64_t cur_offset;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>
  *var;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
  *__range2;
  LoadStoreTracking *this_local;
  
  __end2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
           ::begin(&this->vars);
  var = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
           ::end(&this->vars);
  do {
    bVar1 = std::operator!=(&__end2,(_Self *)&var);
    if (!bVar1) {
      return;
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>
             ::operator*(&__end2);
    sVar4 = std::
            map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
            ::size(&(ppVar3->second).accesses);
    if (sVar4 == 1) {
      (ppVar3->second).struct_layout = false;
    }
    else {
      lStack_38 = 0;
      __range3._4_4_ = 0;
      __end3 = std::
               map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
               ::begin(&(ppVar3->second).accesses);
      access = (pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess> *)
               std::
               map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
               ::end(&(ppVar3->second).accesses);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&access), bVar1) {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>
                 ::operator*(&__end3);
        (ppVar5->second).idx = __range3._4_4_;
        if (((ppVar5->second).is_uniform & 1U) == 0) {
          (ppVar3->second).struct_layout = false;
          break;
        }
        uVar2 = (ppVar5->second).byte_size - 1;
        uVar6 = lStack_38 + (ulong)uVar2 & (ulong)(uVar2 ^ 0xffffffff);
        if (uVar6 != ppVar5->first) {
          (ppVar3->second).struct_layout = false;
          break;
        }
        lStack_38 = (ppVar5->second).byte_size + uVar6;
        std::_Rb_tree_iterator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>::
        operator++(&__end3);
        __range3._4_4_ = __range3._4_4_ + 1;
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void CheckLayouts() {
    // Here we check if the set of accesses we have collected form a sequence
    // we could declare as a struct, meaning they are properly aligned,
    // contiguous, and have no overlaps between different types and sizes.
    // We do this because an int access of size 2 at offset 0 followed by
    // a float access of size 4 at offset 4 can compactly represented as a
    // struct { short, float }, whereas something that reads from overlapping
    // or discontinuous offsets would need a more complicated syntax that
    // involves explicit offsets.
    // We assume that the bulk of memory accesses are of this very regular kind,
    // so we choose not to even emit struct layouts for irregular ones,
    // given that they are rare and confusing, and thus do not benefit from
    // being represented as if they were structs.
    for (auto& var : vars) {
      if (var.second.accesses.size() == 1) {
        // If we have just one access, this is better represented as a pointer
        // than a struct.
        var.second.struct_layout = false;
        continue;
      }
      uint64_t cur_offset = 0;
      uint32_t idx = 0;
      for (auto& access : var.second.accesses) {
        access.second.idx = idx++;
        if (!access.second.is_uniform) {
          var.second.struct_layout = false;
          break;
        }
        // Align to next access: all elements are expected to be aligned to
        // a memory address thats a multiple of their own size.
        auto mask = access.second.byte_size - 1;
        cur_offset = (cur_offset + mask) & ~mask;
        if (cur_offset != access.first) {
          var.second.struct_layout = false;
          break;
        }
        cur_offset += access.second.byte_size;
      }
    }
  }